

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::expression_is_lvalue(Compiler *this,uint32_t id)

{
  SPIRType *pSVar1;
  
  pSVar1 = expression_type(this,id);
  return *(int *)&(pSVar1->super_IVariant).field_0xc - 0x13U < 0xfffffffd;
}

Assistant:

bool Compiler::expression_is_lvalue(uint32_t id) const
{
	auto &type = expression_type(id);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	case SPIRType::Sampler:
		return false;

	default:
		return true;
	}
}